

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot_items.cpp
# Opt level: O2

void ImPlot::BustColorCache(char *plot_title_id)

{
  ImGuiWindow *this;
  ImPlotContext *this_00;
  ImGuiID key;
  ImPlotPlot *pIVar1;
  
  this_00 = GImPlot;
  if (plot_title_id == (char *)0x0) {
    BustItemCache();
    return;
  }
  this = GImGui->CurrentWindow;
  this->WriteAccessed = true;
  key = ImGuiWindow::GetID(this,plot_title_id,(char *)0x0);
  pIVar1 = ImPool<ImPlotPlot>::GetByKey(&this_00->Plots,key);
  if (pIVar1 != (ImPlotPlot *)0x0) {
    pIVar1->ColormapIdx = 0;
    ImPool<ImPlotItem>::Clear(&pIVar1->Items);
    ImPlotLegendData::Reset(&pIVar1->LegendData);
    return;
  }
  return;
}

Assistant:

void BustColorCache(const char* plot_title_id) {
    ImPlotContext& gp = *GImPlot;
    if (plot_title_id == NULL) {
        BustItemCache();
    }
    else {
        ImPlotPlot* plot = gp.Plots.GetByKey(ImGui::GetCurrentWindow()->GetID(plot_title_id));
        if (plot == NULL)
            return;
        plot->ColormapIdx = 0;
        plot->Items.Clear();
        plot->LegendData.Reset();
    }
}